

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS viscosity_law(REF_DBL t,REF_DBL reference_temp_k,REF_DBL *mu)

{
  double dVar1;
  REF_DBL sutherland_temp;
  REF_DBL sutherland_constant_k;
  REF_DBL *mu_local;
  REF_DBL reference_temp_k_local;
  REF_DBL t_local;
  
  *mu = 1.0;
  if (0.0 < reference_temp_k) {
    dVar1 = sqrt(t);
    *mu = ((110.56 / reference_temp_k + 1.0) / (t + 110.56 / reference_temp_k)) * t * dVar1;
  }
  return 0;
}

Assistant:

REF_STATUS viscosity_law(REF_DBL t, REF_DBL reference_temp_k, REF_DBL *mu) {
  REF_DBL sutherland_constant_k = 110.56;
  REF_DBL sutherland_temp;
  *mu = 1.0;
  if (reference_temp_k > 0.0) {
    sutherland_temp = sutherland_constant_k / reference_temp_k;
    *mu = (1.0 + sutherland_temp) / (t + sutherland_temp) * t * sqrt(t);
  }
  return REF_SUCCESS;
}